

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O2

void writeTiledRgbaONE2(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  int tileX;
  int tileY;
  int iVar5;
  Box2i range;
  Array2D<Imf_3_4::Rgba> pixels;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  local_38 = 0;
  uVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,width,height,tileWidth,
             tileHeight,0,0,0xf,&local_38,0,3,uVar3);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D(&pixels,(long)tileHeight,(long)tileWidth);
  iVar5 = 0;
  while( true ) {
    iVar4 = (int)(Rgba *)&out;
    iVar1 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar4);
    if (iVar1 <= iVar5) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar4);
      if (iVar2 <= iVar1) break;
      Imf_3_4::TiledRgbaOutputFile::dataWindowForTile((int)&range,iVar4,iVar1);
      drawImage3(&pixels,width,height,range.min.x,range.max.x + 1,range.min.y,range.max.y + 1,0,0);
      Imf_3_4::TiledRgbaOutputFile::setFrameBuffer
                ((Rgba *)&out,
                 (ulong)(pixels._data + (-(long)range.min.y * pixels._sizeY - (long)range.min.x)),1)
      ;
      Imf_3_4::TiledRgbaOutputFile::writeTile(iVar4,iVar1,iVar5);
      iVar1 = iVar1 + 1;
    }
    iVar5 = iVar5 + 1;
  }
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D(&pixels);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaONE2 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with one level using a tile-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,  // tile size
        ONE_LEVEL,   // level mode
        ROUND_DOWN,  // rounding mode
        WRITE_RGBA); // channels in file

    Array2D<Rgba> pixels (tileHeight, tileWidth);

    for (int tileY = 0; tileY < out.numYTiles (); ++tileY)
    {
        for (int tileX = 0; tileX < out.numXTiles (); ++tileX)
        {
            Box2i range = out.dataWindowForTile (tileX, tileY);

            drawImage3 (
                pixels,
                width,
                height,
                range.min.x,
                range.max.x + 1,
                range.min.y,
                range.max.y + 1,
                0,
                0);

            out.setFrameBuffer (
                &pixels[-range.min.y][-range.min.x],
                1,          // xStride
                tileWidth); // yStride

            out.writeTile (tileX, tileY);
        }
    }
}